

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

void __thiscall TesterThread::ShrinkHeap(TesterThread *this)

{
  while( true ) {
    if (this->heap_size_ < 0x400001) {
      return;
    }
    if ((this->heap_).
        super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->heap_).
        super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    FreeObject(this);
  }
  syscall(1,2,"Check failed: !heap_.empty()\n",0x1d);
  abort();
}

Assistant:

void ShrinkHeap() {
    while (heap_size_ > FLAGS_threadmb << 20) {
      CHECK(!heap_.empty());
      FreeObject();
    }
  }